

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeLiteGenerator::CreateNewProjectFile
          (cmExtraCodeLiteGenerator *this,cmGeneratorTarget *gt,string *filename)

{
  size_t *this_00;
  byte bVar1;
  TargetType TVar2;
  string *psVar3;
  undefined1 local_440 [8];
  string projectPath;
  undefined1 local_400 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherFiles;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  cFiles;
  string projectType;
  undefined1 local_360 [8];
  string visualname;
  string targetName;
  string local_318;
  undefined1 local_2f8 [8];
  cmXMLWriter xml;
  undefined1 local_290 [8];
  cmGeneratedFileStream fout;
  cmMakefile *mf;
  string *filename_local;
  cmGeneratorTarget *gt_local;
  cmExtraCodeLiteGenerator *this_local;
  
  fout._608_8_ = gt->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_290,filename,false,None);
  bVar1 = std::ios::operator!((ios *)(local_290 + (long)*(_func_int **)((long)local_290 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2f8,(ostream *)local_290,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_2f8,"utf-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"CodeLite_Project",
               (allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    cmXMLWriter::StartElement((cmXMLWriter *)local_2f8,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
    std::__cxx11::string::string((string *)(visualname.field_2._M_local_buf + 8),(string *)psVar3);
    std::__cxx11::string::string
              ((string *)local_360,(string *)(visualname.field_2._M_local_buf + 8));
    TVar2 = cmGeneratorTarget::GetType(gt);
    if (TVar2 - STATIC_LIBRARY < 3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&projectType.field_2 + 8),"lib",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&visualname.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)local_360,(string *)(projectType.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(projectType.field_2._M_local_buf + 8));
    }
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_2f8,"Name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360);
    cmXMLWriter::Attribute<char[1]>((cmXMLWriter *)local_2f8,"InternalType",(char (*) [1])0x1017437)
    ;
    std::__cxx11::string::string((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    this_00 = &otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
           *)this_00);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_400);
    CollectSourceFiles((string *)((long)&projectPath.field_2 + 8),this,(cmMakefile *)fout._608_8_,gt
                       ,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                         *)this_00,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_400);
    std::__cxx11::string::operator=
              ((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)(projectPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(projectPath.field_2._M_local_buf + 8));
    cmsys::SystemTools::GetFilenamePath((string *)local_440,filename);
    CreateProjectSourceEntries
              (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                     *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_400,(cmXMLWriter *)local_2f8,(string *)local_440,(cmMakefile *)fout._608_8_,
               (string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)((long)&visualname.field_2 + 8));
    cmXMLWriter::EndElement((cmXMLWriter *)local_2f8);
    std::__cxx11::string::~string((string *)local_440);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_400);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
            *)&otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_360);
    std::__cxx11::string::~string((string *)(visualname.field_2._M_local_buf + 8));
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2f8);
    xml.ElementOpen = false;
    xml.BreakAttrib = false;
    xml.IsContent = false;
    xml._83_1_ = 0;
  }
  else {
    xml.ElementOpen = true;
    xml.BreakAttrib = false;
    xml.IsContent = false;
    xml._83_1_ = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateNewProjectFile(
  const cmGeneratorTarget* gt, const std::string& filename)
{
  const cmMakefile* mf = gt->Makefile;
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  ////////////////////////////////////
  xml.StartDocument("utf-8");
  xml.StartElement("CodeLite_Project");
  std::string targetName = gt->GetName();
  std::string visualname = targetName;
  switch (gt->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      visualname = "lib" + targetName;
      break;
    default:
      break;
  }
  xml.Attribute("Name", visualname);
  xml.Attribute("InternalType", "");

  // Collect all used source files in the project
  // Sort them into two containers, one for C/C++ implementation files
  // which may have an accompanying header, one for all other files
  std::string projectType;

  std::map<std::string, cmSourceFile*> cFiles;
  std::set<std::string> otherFiles;

  projectType = this->CollectSourceFiles(mf, gt, cFiles, otherFiles);

  // Get the project path ( we need it later to convert files to
  // their relative path)
  std::string projectPath = cmSystemTools::GetFilenamePath(filename);

  this->CreateProjectSourceEntries(cFiles, otherFiles, &xml, projectPath, mf,
                                   projectType, targetName);

  xml.EndElement(); // CodeLite_Project
}